

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sslexeme.cpp
# Opt level: O1

int IsCharIdent(char cChar)

{
  uint uVar1;
  
  uVar1 = 1;
  if (0x19 < (byte)(cChar + 0xbfU) && 9 < (byte)(cChar - 0x30U)) {
    uVar1 = (uint)(cChar == '_' || (byte)(cChar + 0x9fU) < 0x1a);
  }
  return uVar1;
}

Assistant:

int IsCharIdent(char cChar)
{
    if ((cChar >= '0' && cChar <= '9') ||
            (cChar >= 'A' && cChar <= 'Z') ||
            (cChar >= 'a' && cChar <= 'z') ||
            cChar == '_')
        return TRUE;
    else
        return FALSE;
}